

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O2

QHash<QByteArray,_QByteArray> parseHttpOptionHeader(QByteArrayView header)

{
  byte bVar1;
  long lVar2;
  QByteArrayView text;
  QByteArrayView text_00;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  qsizetype qVar7;
  qsizetype qVar8;
  void *pvVar9;
  storage_type *in_RDX;
  long from;
  long lVar10;
  uint uVar11;
  char cVar12;
  Data *this;
  uint uVar13;
  int iVar14;
  ulong from_00;
  uint uVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_a8;
  QArrayDataPointer<char> local_90;
  QArrayDataPointer<char> local_78;
  QByteArrayView local_58;
  QByteArrayView header_local;
  
  this = (Data *)header.m_size;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)this = 0;
  header_local.m_size._0_4_ = (uint)header.m_data;
  header_local.m_size._4_4_ = header.m_data._4_4_;
  uVar16 = 0;
  bVar4 = false;
  header_local.m_data = in_RDX;
  do {
    while( true ) {
      lVar10 = CONCAT44(header_local.m_size._4_4_,(uint)header_local.m_size);
      text.m_size._4_4_ = header_local.m_size._4_4_;
      text.m_size._0_4_ = (uint)header_local.m_size;
      text.m_data = header_local.m_data;
      uVar5 = nextNonWhitespace(text,(int)uVar16);
      from = (long)(int)uVar5;
      if (lVar10 == from) goto LAB_001fe005;
      qVar7 = QByteArrayView::indexOf(&header_local,',',from);
      qVar8 = QByteArrayView::indexOf(&header_local,'=',from);
      uVar13 = (uint)qVar7;
      if ((uVar5 == uVar13) || (uVar11 = (uint)qVar8, uVar5 == uVar11)) goto LAB_001fe005;
      uVar6 = uVar13;
      if (uVar13 == 0xffffffff) {
        uVar6 = (uint)header_local.m_size;
      }
      uVar15 = uVar11;
      if ((int)uVar6 < (int)uVar11) {
        uVar15 = uVar6;
      }
      if (uVar11 == 0xffffffff) {
        uVar15 = uVar6;
      }
      local_58.m_data = &DAT_aaaaaaaaaaaaaaaa;
      local_58.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d = (Data *)(long)(int)(uVar15 - uVar5);
      local_78.ptr = header_local.m_data + from;
      local_58 = QByteArrayView::trimmed((QByteArrayView *)&local_78);
      uVar16 = (ulong)(uVar15 + 1);
      if (uVar11 < uVar13) break;
      QByteArrayView::toByteArray((QByteArray *)&local_90,&local_58);
      QByteArray::toLower_helper((QByteArray *)&local_78);
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char *)0x0;
      local_a8.size = 0;
      QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
                ((QHash<QByteArray,QByteArray> *)this,(QByteArray *)&local_78,
                 (QByteArray *)&local_a8);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_90);
    }
    lVar10 = CONCAT44(header_local.m_size._4_4_,(uint)header_local.m_size);
    text_00.m_size._4_4_ = header_local.m_size._4_4_;
    text_00.m_size._0_4_ = (uint)header_local.m_size;
    text_00.m_data = header_local.m_data;
    uVar5 = nextNonWhitespace(text_00,uVar15 + 1);
    uVar16 = (ulong)(int)uVar5;
    lVar10 = lVar10 - uVar16;
    if (lVar10 == 0) goto LAB_001fe005;
    from_00 = (ulong)uVar5;
    local_78.d = (Data *)0x0;
    local_78.ptr = (storage_type *)0x0;
    local_78.size = 0;
    QByteArray::reserve((QByteArray *)&local_78,lVar10);
    cVar12 = (char)&local_78;
    if (header_local.m_data[uVar16] == '\"') {
      while( true ) {
        iVar14 = (int)from_00;
        from_00 = (long)iVar14 + 1;
        if (CONCAT44(header_local.m_size._4_4_,(uint)header_local.m_size) <= (long)from_00) break;
        if (header_local.m_data[from_00] == '\\') {
          uVar16 = (long)iVar14 + 2;
          if (CONCAT44(header_local.m_size._4_4_,(uint)header_local.m_size) <= (long)uVar16)
          goto LAB_001fdfdc;
          from_00 = uVar16 & 0xffffffff;
        }
        else {
          uVar16 = from_00 & 0xffffffff;
          if (header_local.m_data[from_00] == '\"') goto LAB_001fdf7d;
        }
        QByteArray::append(cVar12);
      }
      uVar16 = from_00 & 0xffffffff;
    }
    else {
      lVar10 = uVar16 << 0x20;
      for (; (long)uVar16 < CONCAT44(header_local.m_size._4_4_,(uint)header_local.m_size);
          uVar16 = uVar16 + 1) {
        bVar1 = header_local.m_data[uVar16];
        if ((((ulong)bVar1 < 0x21) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
           (pvVar9 = memchr(parseHttpOptionHeader(QByteArrayView)::$_0::operator()(char)::separators
                            ,(int)(char)bVar1,0x12), pvVar9 != (void *)0x0)) break;
        QByteArray::append(cVar12);
        lVar10 = lVar10 + 0x100000000;
      }
      from_00 = lVar10 >> 0x20;
    }
LAB_001fdf7d:
    QByteArrayView::toByteArray((QByteArray *)&local_a8,&local_58);
    QByteArray::toLower_helper((QByteArray *)&local_90);
    QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
              ((QHash<QByteArray,QByteArray> *)this,(QByteArray *)&local_90,(QByteArray *)&local_78)
    ;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_90);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
    qVar7 = QByteArrayView::indexOf(&header_local,',',from_00);
    if ((int)qVar7 == -1) {
LAB_001fdfdc:
      bVar4 = true;
      bVar3 = false;
    }
    else {
      bVar3 = true;
      uVar16 = (ulong)((int)qVar7 + 1);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  } while (bVar3);
  if (!bVar4) {
    QHash<QByteArray,_QByteArray>::~QHash((QHash<QByteArray,_QByteArray> *)this);
  }
LAB_001fe005:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (QHash<QByteArray,_QByteArray>)this;
}

Assistant:

static QHash<QByteArray, QByteArray> parseHttpOptionHeader(QByteArrayView header)
{
    // The HTTP header is of the form:
    // header          = #1(directives)
    // directives      = token | value-directive
    // value-directive = token "=" (token | quoted-string)
    QHash<QByteArray, QByteArray> result;

    int pos = 0;
    while (true) {
        // skip spaces
        pos = nextNonWhitespace(header, pos);
        if (pos == header.size())
            return result;      // end of parsing

        // pos points to a non-whitespace
        int comma = header.indexOf(',', pos);
        int equal = header.indexOf('=', pos);
        if (comma == pos || equal == pos)
            // huh? Broken header.
            return result;

        // The key name is delimited by either a comma, an equal sign or the end
        // of the header, whichever comes first
        int end = comma;
        if (end == -1)
            end = header.size();
        if (equal != -1 && end > equal)
            end = equal;        // equal sign comes before comma/end
        const auto key = header.sliced(pos, end - pos).trimmed();
        pos = end + 1;

        if (uint(equal) < uint(comma)) {
            // case: token "=" (token | quoted-string)
            // skip spaces
            pos = nextNonWhitespace(header, pos);
            if (pos == header.size())
                // huh? Broken header
                return result;

            QByteArray value;
            value.reserve(header.size() - pos);
            if (header.at(pos) == '"') {
                // case: quoted-string
                // quoted-string  = ( <"> *(qdtext | quoted-pair ) <"> )
                // qdtext         = <any TEXT except <">>
                // quoted-pair    = "\" CHAR
                ++pos;
                while (pos < header.size()) {
                    char c = header.at(pos);
                    if (c == '"') {
                        // end of quoted text
                        break;
                    } else if (c == '\\') {
                        ++pos;
                        if (pos >= header.size())
                            // broken header
                            return result;
                        c = header.at(pos);
                    }

                    value += c;
                    ++pos;
                }
            } else {
                const auto isSeparator = [](char c) {
                    static const char separators[] = "()<>@,;:\\\"/[]?={}";
                    return isLWS(c) || strchr(separators, c) != nullptr;
                };

                // case: token
                while (pos < header.size()) {
                    char c = header.at(pos);
                    if (isSeparator(c))
                        break;
                    value += c;
                    ++pos;
                }
            }

            result.insert(key.toByteArray().toLower(), value);

            // find the comma now:
            comma = header.indexOf(',', pos);
            if (comma == -1)
                return result;  // end of parsing
            pos = comma + 1;
        } else {
            // case: token
            // key is already set
            result.insert(key.toByteArray().toLower(), QByteArray());
        }
    }
}